

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

void * prepend_alloc(mstate m,char *newbase,char *oldbase,size_t nb)

{
  long lVar1;
  malloc_chunk *pmVar2;
  long *plVar3;
  malloc_tree_chunk *pmVar4;
  malloc_tree_chunk *pmVar5;
  long lVar6;
  char *pcVar7;
  tbinptr pmVar8;
  malloc_tree_chunk **ppmVar9;
  byte bVar10;
  uint uVar11;
  mchunkptr pmVar12;
  uint uVar13;
  ulong uVar14;
  malloc_chunk *pmVar15;
  malloc_chunk *pmVar16;
  ulong uVar17;
  long lVar18;
  tbinptr pmVar19;
  tbinptr pmVar20;
  malloc_tree_chunk **ppmVar21;
  
  uVar14 = (ulong)(-(int)m - 0x10U & 0xf);
  lVar1 = (long)m->smallbins + (uVar14 - 0x48);
  pmVar19 = (tbinptr)(newbase + (-(int)newbase - 0x10U & 0xf));
  pmVar2 = (malloc_chunk *)(oldbase + lVar1);
  uVar17 = (long)pmVar19 - (long)pmVar2;
  *(ulong *)((long)m->smallbins + (uVar14 - 0x40)) = (ulong)oldbase | 3;
  if (pmVar19 == (tbinptr)_gm_.top) {
    _gm_.topsize = uVar17 + _gm_.topsize;
    _gm_.top = pmVar2;
    pmVar2->head = _gm_.topsize | 1;
    goto LAB_0010b670;
  }
  if (pmVar19 == (tbinptr)_gm_.dv) {
    uVar17 = uVar17 + _gm_.dvsize;
    _gm_.dvsize = uVar17;
    _gm_.dv = pmVar2;
    pmVar2->head = uVar17 | 1;
    *(ulong *)((long)pmVar2 + uVar17) = uVar17;
    goto LAB_0010b670;
  }
  uVar14 = pmVar19->head;
  pmVar20 = pmVar19;
  if (((uint)uVar14 & 3) == 1) {
    if (uVar14 < 0x100) {
      pmVar4 = pmVar19->fd;
      pmVar5 = pmVar19->bk;
      if ((pmVar4 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
         ((pmVar4 < _gm_.least_addr || (pmVar4->bk != pmVar19)))) goto LAB_0010b67e;
      if (pmVar5 == pmVar4) {
        bVar10 = (byte)(uVar14 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
      }
      else {
        if ((pmVar5 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
           ((pmVar5 < _gm_.least_addr || (pmVar5->fd != pmVar19)))) goto LAB_0010b67e;
        pmVar4->bk = pmVar5;
        pmVar5->fd = pmVar4;
      }
    }
    else {
      pmVar20 = pmVar19->bk;
      pmVar4 = pmVar19->parent;
      if (pmVar20 == pmVar19) {
        if (pmVar19->child[1] == (tbinptr)0x0) {
          if (pmVar19->child[0] == (tbinptr)0x0) {
            pmVar20 = (tbinptr)0x0;
            goto LAB_0010b426;
          }
          pmVar8 = pmVar19->child[0];
          ppmVar9 = pmVar19->child;
        }
        else {
          pmVar8 = pmVar19->child[1];
          ppmVar9 = pmVar19->child + 1;
        }
        do {
          do {
            ppmVar21 = ppmVar9;
            pmVar20 = pmVar8;
            pmVar8 = pmVar20->child[1];
            ppmVar9 = pmVar20->child + 1;
          } while (pmVar20->child[1] != (malloc_tree_chunk *)0x0);
          pmVar8 = pmVar20->child[0];
          ppmVar9 = pmVar20->child;
        } while (pmVar20->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar21 < _gm_.least_addr) goto LAB_0010b67e;
        *ppmVar21 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar5 = pmVar19->fd;
        if (((pmVar5 < _gm_.least_addr) || (pmVar5->bk != pmVar19)) || (pmVar20->fd != pmVar19))
        goto LAB_0010b67e;
        pmVar5->bk = pmVar20;
        pmVar20->fd = pmVar5;
      }
LAB_0010b426:
      if (pmVar4 != (malloc_tree_chunk *)0x0) {
        uVar13 = pmVar19->index;
        if (pmVar19 == _gm_.treebins[uVar13]) {
          _gm_.treebins[uVar13] = pmVar20;
          if (pmVar20 == (tbinptr)0x0) {
            bVar10 = (byte)uVar13 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
          }
          else {
LAB_0010b473:
            pcVar7 = _gm_.least_addr;
            if (pmVar20 < _gm_.least_addr) goto LAB_0010b67e;
            pmVar20->parent = pmVar4;
            pmVar4 = pmVar19->child[0];
            if (pmVar4 != (malloc_tree_chunk *)0x0) {
              if (pmVar4 < pcVar7) goto LAB_0010b67e;
              pmVar20->child[0] = pmVar4;
              pmVar4->parent = pmVar20;
            }
            pmVar4 = pmVar19->child[1];
            if (pmVar4 != (malloc_tree_chunk *)0x0) {
              if (pmVar4 < pcVar7) goto LAB_0010b67e;
              pmVar20->child[1] = pmVar4;
              pmVar4->parent = pmVar20;
            }
          }
        }
        else {
          if (pmVar4 < _gm_.least_addr) goto LAB_0010b67e;
          pmVar4->child[pmVar4->child[0] != pmVar19] = pmVar20;
          if (pmVar20 != (tbinptr)0x0) goto LAB_0010b473;
        }
      }
    }
    uVar14 = uVar14 & 0xfffffffffffffff8;
    pmVar20 = (tbinptr)((long)&pmVar19->prev_foot + uVar14);
    uVar17 = uVar17 + uVar14;
    uVar14 = *(ulong *)((long)&pmVar19->head + uVar14);
  }
  pmVar20->head = uVar14 & 0xfffffffffffffffe;
  pmVar2->head = uVar17 | 1;
  *(ulong *)((long)&pmVar2->prev_foot + uVar17) = uVar17;
  if (uVar17 < 0x100) {
    uVar17 = uVar17 >> 3;
    if ((_gm_.smallmap >> ((uint)uVar17 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar17 & 0x1f);
      pmVar12 = (malloc_chunk *)(_gm_.smallbins + uVar17 * 2);
    }
    else {
      pmVar12 = _gm_.smallbins[uVar17 * 2 + 2];
      if (_gm_.smallbins[uVar17 * 2 + 2] < _gm_.least_addr) {
LAB_0010b67e:
        abort();
      }
    }
    _gm_.smallbins[uVar17 * 2 + 2] = pmVar2;
    pmVar12->bk = pmVar2;
    pmVar2->fd = pmVar12;
    pmVar2->bk = (malloc_chunk *)(_gm_.smallbins + uVar17 * 2);
  }
  else {
    uVar13 = (uint)(uVar17 >> 8);
    if (uVar13 == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0x1f;
      if (uVar13 < 0x10000) {
        uVar11 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar11 = (uint)((uVar17 >> ((ulong)(byte)(0x26 - (char)(uVar11 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar11 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar15 = (malloc_chunk *)(_gm_.treebins + uVar11);
    *(uint *)&pmVar2[1].bk = uVar11;
    pmVar2[1].prev_foot = 0;
    pmVar2[1].head = 0;
    if ((_gm_.treemap >> (uVar11 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar11 & 0x1f);
      pmVar15->prev_foot = (size_t)pmVar2;
      pmVar2[1].fd = pmVar15;
    }
    else {
      bVar10 = 0x39 - (char)(uVar11 >> 1);
      if (uVar11 == 0x1f) {
        bVar10 = 0;
      }
      lVar18 = uVar17 << (bVar10 & 0x3f);
      pmVar15 = (malloc_chunk *)pmVar15->prev_foot;
      do {
        pmVar16 = pmVar15;
        if ((pmVar16->head & 0xfffffffffffffff8) == uVar17) {
          if ((pmVar16 < _gm_.least_addr) || (pmVar15 = pmVar16->fd, pmVar15 < _gm_.least_addr))
          goto LAB_0010b67e;
          pmVar15->bk = pmVar2;
          pmVar16->fd = pmVar2;
          pmVar2->fd = pmVar15;
          pmVar2->bk = pmVar16;
          pmVar2[1].fd = (malloc_chunk *)0x0;
          goto LAB_0010b670;
        }
        lVar6 = lVar18 >> 0x3f;
        lVar18 = lVar18 * 2;
        pmVar15 = *(malloc_chunk **)((long)pmVar16 + lVar6 * -8 + 0x20);
      } while (pmVar15 != (malloc_chunk *)0x0);
      plVar3 = (long *)((long)pmVar16 + lVar6 * -8 + 0x20);
      if (plVar3 < _gm_.least_addr) goto LAB_0010b67e;
      *plVar3 = (long)pmVar2;
      pmVar2[1].fd = pmVar16;
    }
    pmVar2->bk = pmVar2;
    pmVar2->fd = pmVar2;
  }
LAB_0010b670:
  return (void *)(lVar1 + 0x10);
}

Assistant:

static void* prepend_alloc(mstate m, char* newbase, char* oldbase,
                           size_t nb) {
  mchunkptr p = align_as_chunk(newbase);
  mchunkptr oldfirst = align_as_chunk(oldbase);
  size_t psize = (char*)oldfirst - (char*)p;
  mchunkptr q = chunk_plus_offset(p, nb);
  size_t qsize = psize - nb;
  set_size_and_pinuse_of_inuse_chunk(m, p, nb);

  assert((char*)oldfirst > (char*)q);
  assert(pinuse(oldfirst));
  assert(qsize >= MIN_CHUNK_SIZE);

  /* consolidate remainder with first chunk of old base */
  if (oldfirst == m->top) {
    size_t tsize = m->topsize += qsize;
    m->top = q;
    q->head = tsize | PINUSE_BIT;
    check_top_chunk(m, q);
  }
  else if (oldfirst == m->dv) {
    size_t dsize = m->dvsize += qsize;
    m->dv = q;
    set_size_and_pinuse_of_free_chunk(q, dsize);
  }
  else {
    if (!is_inuse(oldfirst)) {
      size_t nsize = chunksize(oldfirst);
      unlink_chunk(m, oldfirst, nsize);
      oldfirst = chunk_plus_offset(oldfirst, nsize);
      qsize += nsize;
    }
    set_free_with_pinuse(q, qsize, oldfirst);
    insert_chunk(m, q, qsize);
    check_free_chunk(m, q);
  }

  check_malloced_chunk(m, chunk2mem(p), nb);
  return chunk2mem(p);
}